

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

Tour * tour_copy(Tour *__return_storage_ptr__,Tour *other)

{
  int32_t *piVar1;
  Tour *result;
  Tour *other_local;
  
  memset(__return_storage_ptr__,0,0x18);
  __return_storage_ptr__->num_customers = other->num_customers;
  __return_storage_ptr__->num_comps = other->num_comps;
  piVar1 = veci32_copy(other->succ,__return_storage_ptr__->num_customers + 1);
  __return_storage_ptr__->succ = piVar1;
  piVar1 = veci32_copy(other->comp,__return_storage_ptr__->num_customers + 1);
  __return_storage_ptr__->comp = piVar1;
  return __return_storage_ptr__;
}

Assistant:

Tour tour_copy(Tour const *other) {
    Tour result = {0};
    result.num_customers = other->num_customers;

    result.num_comps = other->num_comps;
    result.succ = veci32_copy(other->succ, result.num_customers + 1);
    result.comp = veci32_copy(other->comp, result.num_customers + 1);
    return result;
}